

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chr.cpp
# Opt level: O1

void duckdb::ChrOperator::GetCodepoint(int32_t input,char *c,int *utf8_bytes)

{
  bool bVar1;
  InvalidInputException *this;
  string local_48;
  
  if (-1 < input) {
    bVar1 = Utf8Proc::CodepointToUtf8(input,utf8_bytes,c);
    if (bVar1) {
      return;
    }
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid UTF8 Codepoint %d","");
  InvalidInputException::InvalidInputException<int>(this,&local_48,input);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void GetCodepoint(int32_t input, char c[], int &utf8_bytes) {
		if (input < 0 || !Utf8Proc::CodepointToUtf8(input, utf8_bytes, &c[0])) {
			throw InvalidInputException("Invalid UTF8 Codepoint %d", input);
		}
	}